

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::CreateTextureARGB8_3DGS_MDL3(MDLImporter *this,uchar *szData)

{
  aiTexture **ppaVar1;
  undefined1 auVar2 [16];
  aiTexture *this_00;
  ulong uVar3;
  void *pvVar4;
  uchar *puVar5;
  aiTexture **ppaVar6;
  uint local_4c;
  uint i_1;
  aiTexture **pc;
  uchar *sz;
  uchar val;
  uchar *puStack_30;
  uint i;
  uchar *szColorMap;
  aiTexture *pcNew;
  Header *pcHeader;
  uchar *szData_local;
  MDLImporter *this_local;
  
  pcNew = (aiTexture *)this->mBuffer;
  pcHeader = (Header *)szData;
  szData_local = (uchar *)this;
  SizeCheck(this,szData + *(int *)((pcNew->mFilename).data + 0x10) *
                          *(int *)((pcNew->mFilename).data + 0x14),
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x8c);
  this_00 = (aiTexture *)operator_new(0x428);
  aiTexture::aiTexture(this_00);
  this_00->mWidth = *(uint *)((pcNew->mFilename).data + 0x10);
  this_00->mHeight = *(uint *)((pcNew->mFilename).data + 0x14);
  auVar2 = ZEXT416(this_00->mWidth * this_00->mHeight) * ZEXT816(4);
  uVar3 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  szColorMap = (uchar *)this_00;
  pvVar4 = operator_new__(uVar3);
  *(void **)(szColorMap + 0x18) = pvVar4;
  SearchPalette(this,&stack0xffffffffffffffd0);
  for (sz._4_4_ = 0; sz._4_4_ < (uint)(*(int *)szColorMap * *(int *)(szColorMap + 4));
      sz._4_4_ = sz._4_4_ + 1) {
    puVar5 = puStack_30 + (int)((uint)*(byte *)((long)pcHeader->scale + ((ulong)sz._4_4_ - 8)) * 3);
    *(undefined1 *)(*(long *)(szColorMap + 0x18) + 3 + (ulong)sz._4_4_ * 4) = 0xff;
    *(uchar *)(*(long *)(szColorMap + 0x18) + 2 + (ulong)sz._4_4_ * 4) = *puVar5;
    *(uchar *)(*(long *)(szColorMap + 0x18) + 1 + (ulong)sz._4_4_ * 4) = puVar5[1];
    *(uchar *)(*(long *)(szColorMap + 0x18) + (ulong)sz._4_4_ * 4) = puVar5[2];
  }
  FreePalette(this,puStack_30);
  ppaVar1 = this->pScene->mTextures;
  auVar2 = ZEXT416(this->pScene->mNumTextures + 1) * ZEXT816(8);
  uVar3 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppaVar6 = (aiTexture **)operator_new__(uVar3);
  this->pScene->mTextures = ppaVar6;
  for (local_4c = 0; local_4c < this->pScene->mNumTextures; local_4c = local_4c + 1) {
    this->pScene->mTextures[local_4c] = ppaVar1[local_4c];
  }
  this->pScene->mTextures[this->pScene->mNumTextures] = (aiTexture *)szColorMap;
  this->pScene->mNumTextures = this->pScene->mNumTextures + 1;
  if (ppaVar1 != (aiTexture **)0x0) {
    operator_delete__(ppaVar1);
  }
  return;
}

Assistant:

void MDLImporter::CreateTextureARGB8_3DGS_MDL3(const unsigned char* szData)
{
    const MDL::Header *pcHeader = (const MDL::Header*)mBuffer;  //the endianness is already corrected in the InternReadFile_3DGS_MDL345 function

    VALIDATE_FILE_SIZE(szData + pcHeader->skinwidth *
        pcHeader->skinheight);

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();
    pcNew->mWidth = pcHeader->skinwidth;
    pcNew->mHeight = pcHeader->skinheight;

    pcNew->pcData = new aiTexel[pcNew->mWidth * pcNew->mHeight];

    const unsigned char* szColorMap;
    this->SearchPalette(&szColorMap);

    // copy texture data
    for (unsigned int i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
    {
        const unsigned char val = szData[i];
        const unsigned char* sz = &szColorMap[val*3];

        pcNew->pcData[i].a = 0xFF;
        pcNew->pcData[i].r = *sz++;
        pcNew->pcData[i].g = *sz++;
        pcNew->pcData[i].b = *sz;
    }

    FreePalette(szColorMap);

    // store the texture
    aiTexture** pc = this->pScene->mTextures;
    this->pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
    for (unsigned int i = 0; i <pScene->mNumTextures;++i)
        pScene->mTextures[i] = pc[i];

    pScene->mTextures[this->pScene->mNumTextures] = pcNew;
    pScene->mNumTextures++;
    delete[] pc;
    return;
}